

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::BasicWriter<char>::write_int<int,fmt::FormatSpec>
          (BasicWriter<char> *this,int value,FormatSpec spec)

{
  ThousandsSep thousands_sep;
  StringRef sep_00;
  bool bVar1;
  char cVar2;
  uint uVar3;
  ulong uVar4;
  CharPtr pcVar5;
  lconv *plVar6;
  size_t sVar7;
  char *pcVar8;
  char *local_e8;
  char local_d9;
  ThousandsSep local_b8;
  char *local_a0;
  CharPtr p_4;
  uint size;
  char *local_88;
  undefined1 local_80 [8];
  StringRef sep;
  char *pcStack_68;
  uint num_digits_4;
  char *p_3;
  uint num_digits_3;
  UnsignedType n_2;
  char *p_2;
  uint num_digits_2;
  UnsignedType n_1;
  char *digits;
  char *p_1;
  uint num_digits_1;
  UnsignedType n;
  CharPtr p;
  char local_20 [4];
  uint num_digits;
  char prefix [4];
  UnsignedType abs_value;
  uint prefix_size;
  int value_local;
  BasicWriter<char> *this_local;
  
  prefix[0] = '\0';
  prefix[1] = '\0';
  prefix[2] = '\0';
  prefix[3] = '\0';
  num_digits = value;
  memset(local_20,0,4);
  bVar1 = internal::is_negative<int>(value);
  if (bVar1) {
    local_20[0] = '-';
    prefix = (char  [4])((int)prefix + 1);
    num_digits = -num_digits;
  }
  else {
    bVar1 = FormatSpec::flag(&spec,1);
    if (bVar1) {
      bVar1 = FormatSpec::flag(&spec,2);
      local_d9 = '+';
      if (!bVar1) {
        local_d9 = ' ';
      }
      local_20[0] = local_d9;
      prefix = (char  [4])((int)prefix + 1);
    }
  }
  cVar2 = FormatSpec::type(&spec);
  if (cVar2 == '\0') {
LAB_00148076:
    uVar3 = internal::count_digits(num_digits);
    pcVar5 = prepare_int_buffer<fmt::FormatSpec>(this,uVar3,&spec,local_20,(uint)prefix);
    pcVar8 = get(pcVar5 + 1);
    internal::format_decimal<unsigned_int,char>(pcVar8,num_digits,0);
    return;
  }
  if (cVar2 == 'B') {
LAB_001481d0:
    p_2._4_4_ = num_digits;
    bVar1 = FormatSpec::flag(&spec,8);
    if (bVar1) {
      uVar4 = (ulong)(uint)prefix;
      prefix = (char  [4])((int)prefix + 1);
      local_20[uVar4] = '0';
      cVar2 = FormatSpec::type_prefix(&spec);
      uVar4 = (ulong)(uint)prefix;
      prefix = (char  [4])((int)prefix + 1);
      local_20[uVar4] = cVar2;
    }
    p_2._0_4_ = 0;
    do {
      p_2._0_4_ = (uint)p_2 + 1;
      p_2._4_4_ = p_2._4_4_ >> 1;
    } while (p_2._4_4_ != 0);
    pcVar5 = prepare_int_buffer<fmt::FormatSpec>(this,(uint)p_2,&spec,local_20,(uint)prefix);
    _num_digits_3 = get(pcVar5);
    p_2._4_4_ = num_digits;
    do {
      *_num_digits_3 = ((byte)p_2._4_4_ & 1) + 0x30;
      p_2._4_4_ = p_2._4_4_ >> 1;
      _num_digits_3 = _num_digits_3 + -1;
    } while (p_2._4_4_ != 0);
  }
  else {
    if (cVar2 != 'X') {
      if (cVar2 == 'b') goto LAB_001481d0;
      if (cVar2 == 'd') goto LAB_00148076;
      if (cVar2 == 'n') {
        sep.size_._4_4_ = internal::count_digits(num_digits);
        BasicStringRef<char>::BasicStringRef((BasicStringRef<char> *)local_80,"");
        plVar6 = localeconv();
        internal::LConvCheck<char_*lconv::*,_&lconv::thousands_sep>::LConvCheck
                  ((LConvCheck<char_*lconv::*,_&lconv::thousands_sep> *)((long)&p_4 + 7),0);
        _size = internal::thousands_sep<lconv>(plVar6);
        uVar3 = sep.size_._4_4_;
        local_80 = (undefined1  [8])_size;
        sep.data_ = local_88;
        sVar7 = BasicStringRef<char>::size((BasicStringRef<char> *)local_80);
        p_4._0_4_ = uVar3 + (int)sVar7 * ((sep.size_._4_4_ - 1) / 3);
        pcVar5 = prepare_int_buffer<fmt::FormatSpec>(this,(uint)p_4,&spec,local_20,(uint)prefix);
        local_a0 = pcVar5 + 1;
        pcVar8 = get(local_a0);
        uVar3 = num_digits;
        sep_00.size_ = (size_t)sep.data_;
        sep_00.data_ = (char *)local_80;
        internal::ThousandsSep::ThousandsSep(&local_b8,sep_00);
        thousands_sep.sep_.size_ = local_b8.sep_.size_;
        thousands_sep.sep_.data_ = local_b8.sep_.data_;
        thousands_sep.digit_index_ = local_b8.digit_index_;
        thousands_sep._20_4_ = local_b8._20_4_;
        internal::format_decimal<unsigned_int,char,fmt::internal::ThousandsSep>
                  (pcVar8,uVar3,0,thousands_sep);
        return;
      }
      if (cVar2 == 'o') {
        p_3._4_4_ = num_digits;
        bVar1 = FormatSpec::flag(&spec,8);
        if (bVar1) {
          uVar4 = (ulong)(uint)prefix;
          prefix = (char  [4])((int)prefix + 1);
          local_20[uVar4] = '0';
        }
        p_3._0_4_ = 0;
        do {
          p_3._0_4_ = (uint)p_3 + 1;
          p_3._4_4_ = p_3._4_4_ >> 3;
        } while (p_3._4_4_ != 0);
        pcVar5 = prepare_int_buffer<fmt::FormatSpec>(this,(uint)p_3,&spec,local_20,(uint)prefix);
        pcStack_68 = get(pcVar5);
        p_3._4_4_ = num_digits;
        do {
          *pcStack_68 = ((byte)p_3._4_4_ & 7) + 0x30;
          p_3._4_4_ = p_3._4_4_ >> 3;
          pcStack_68 = pcStack_68 + -1;
        } while (p_3._4_4_ != 0);
        return;
      }
      if (cVar2 != 'x') {
        cVar2 = FormatSpec::type(&spec);
        bVar1 = FormatSpec::flag(&spec,0x10);
        pcVar8 = "integer";
        if (bVar1) {
          pcVar8 = "char";
        }
        internal::report_unknown_type(cVar2,pcVar8);
      }
    }
    p_1._4_4_ = num_digits;
    bVar1 = FormatSpec::flag(&spec,8);
    if (bVar1) {
      uVar4 = (ulong)(uint)prefix;
      prefix = (char  [4])((int)prefix + 1);
      local_20[uVar4] = '0';
      cVar2 = FormatSpec::type_prefix(&spec);
      uVar4 = (ulong)(uint)prefix;
      prefix = (char  [4])((int)prefix + 1);
      local_20[uVar4] = cVar2;
    }
    p_1._0_4_ = 0;
    do {
      p_1._0_4_ = (uint)p_1 + 1;
      p_1._4_4_ = p_1._4_4_ >> 4;
    } while (p_1._4_4_ != 0);
    pcVar5 = prepare_int_buffer<fmt::FormatSpec>(this,(uint)p_1,&spec,local_20,(uint)prefix);
    digits = get(pcVar5);
    p_1._4_4_ = num_digits;
    cVar2 = FormatSpec::type(&spec);
    if (cVar2 == 'x') {
      local_e8 = "0123456789abcdef";
    }
    else {
      local_e8 = "0123456789ABCDEF";
    }
    do {
      *digits = local_e8[p_1._4_4_ & 0xf];
      p_1._4_4_ = p_1._4_4_ >> 4;
      digits = digits + -1;
    } while (p_1._4_4_ != 0);
  }
  return;
}

Assistant:

void BasicWriter<Char>::write_int(T value, Spec spec) {
  unsigned prefix_size = 0;
  typedef typename internal::IntTraits<T>::MainType UnsignedType;
  UnsignedType abs_value = static_cast<UnsignedType>(value);
  char prefix[4] = "";
  if (internal::is_negative(value)) {
    prefix[0] = '-';
    ++prefix_size;
    abs_value = 0 - abs_value;
  } else if (spec.flag(SIGN_FLAG)) {
    prefix[0] = spec.flag(PLUS_FLAG) ? '+' : ' ';
    ++prefix_size;
  }
  switch (spec.type()) {
  case 0: case 'd': {
    unsigned num_digits = internal::count_digits(abs_value);
    CharPtr p = prepare_int_buffer(num_digits, spec, prefix, prefix_size) + 1;
    internal::format_decimal(get(p), abs_value, 0);
    break;
  }
  case 'x': case 'X': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG)) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = spec.type_prefix();
    }
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 4) != 0);
    Char *p = get(prepare_int_buffer(
      num_digits, spec, prefix, prefix_size));
    n = abs_value;
    const char *digits = spec.type() == 'x' ?
        "0123456789abcdef" : "0123456789ABCDEF";
    do {
      *p-- = digits[n & 0xf];
    } while ((n >>= 4) != 0);
    break;
  }
  case 'b': case 'B': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG)) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = spec.type_prefix();
    }
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 1) != 0);
    Char *p = get(prepare_int_buffer(num_digits, spec, prefix, prefix_size));
    n = abs_value;
    do {
      *p-- = static_cast<Char>('0' + (n & 1));
    } while ((n >>= 1) != 0);
    break;
  }
  case 'o': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG))
      prefix[prefix_size++] = '0';
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 3) != 0);
    Char *p = get(prepare_int_buffer(num_digits, spec, prefix, prefix_size));
    n = abs_value;
    do {
      *p-- = static_cast<Char>('0' + (n & 7));
    } while ((n >>= 3) != 0);
    break;
  }
  case 'n': {
    unsigned num_digits = internal::count_digits(abs_value);
    fmt::StringRef sep = "";
#if !(defined(ANDROID) || defined(__ANDROID__))
    sep = internal::thousands_sep(std::localeconv());
#endif
    unsigned size = static_cast<unsigned>(
          num_digits + sep.size() * ((num_digits - 1) / 3));
    CharPtr p = prepare_int_buffer(size, spec, prefix, prefix_size) + 1;
    internal::format_decimal(get(p), abs_value, 0, internal::ThousandsSep(sep));
    break;
  }
  default:
    internal::report_unknown_type(
      spec.type(), spec.flag(CHAR_FLAG) ? "char" : "integer");
    break;
  }
}